

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_map_field.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::javanano::(anonymous_namespace)::TypeName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Params *params,
          FieldDescriptor *field,bool boxed)

{
  FieldDescriptor *this_00;
  Params *params_00;
  LogMessage *other;
  string *descriptor;
  JavaType type;
  allocator<char> local_6e;
  LogFinisher local_6d [13];
  LogMessage local_60;
  JavaType local_28;
  byte local_21;
  JavaType java_type;
  bool boxed_local;
  FieldDescriptor *field_local;
  Params *params_local;
  
  local_21 = (byte)field & 1;
  descriptor = __return_storage_ptr__;
  _java_type = params;
  field_local = (FieldDescriptor *)this;
  params_local = (Params *)__return_storage_ptr__;
  local_28 = GetJavaType((FieldDescriptor *)params);
  this_00 = field_local;
  if (local_28 < JAVATYPE_MESSAGE) {
    if ((local_21 & 1) == 0) {
      PrimitiveTypeName_abi_cxx11_(__return_storage_ptr__,(javanano *)(ulong)local_28,type);
    }
    else {
      BoxedPrimitiveTypeName_abi_cxx11_(__return_storage_ptr__,(javanano *)(ulong)local_28,type);
    }
  }
  else if (local_28 == JAVATYPE_MESSAGE) {
    params_00 = (Params *)FieldDescriptor::message_type((FieldDescriptor *)_java_type);
    ClassName_abi_cxx11_
              (__return_storage_ptr__,(javanano *)this_00,params_00,(Descriptor *)descriptor);
  }
  else {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/javanano/javanano_map_field.cc"
               ,0x44);
    other = internal::LogMessage::operator<<(&local_60,"should not reach here.");
    internal::LogFinisher::operator=(local_6d,other);
    internal::LogMessage::~LogMessage(&local_60);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_6e);
    std::allocator<char>::~allocator(&local_6e);
  }
  return __return_storage_ptr__;
}

Assistant:

string TypeName(const Params& params, const FieldDescriptor* field,
                bool boxed) {
  JavaType java_type = GetJavaType(field);
  switch (java_type) {
    case JAVATYPE_MESSAGE:
      return ClassName(params, field->message_type());
    case JAVATYPE_INT:
    case JAVATYPE_LONG:
    case JAVATYPE_FLOAT:
    case JAVATYPE_DOUBLE:
    case JAVATYPE_BOOLEAN:
    case JAVATYPE_STRING:
    case JAVATYPE_BYTES:
    case JAVATYPE_ENUM:
      if (boxed) {
        return BoxedPrimitiveTypeName(java_type);
      } else {
        return PrimitiveTypeName(java_type);
      }
    // No default because we want the compiler to complain if any new JavaTypes
    // are added..
  }

  GOOGLE_LOG(FATAL) << "should not reach here.";
  return "";
}